

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 11.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  char *pcVar2;
  int x;
  char eme [8];
  int local_14;
  char local_10 [8];
  
  builtin_strncpy(local_10,"\x1b[1;35m",8);
  std::operator<<((ostream *)&std::cout,local_10);
  std::operator<<((ostream *)&std::cout,"Qual o dia em que nietzsche nasceu?");
  std::istream::operator>>((istream *)&std::cin,&local_14);
  if (local_14 == 0x1e) {
    pcVar2 = 
    "Quinze dias a menos e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1944.";
  }
  else if (local_14 == 0xf) {
    pcVar2 = "YES! No dia 15 de outubro de 1844 nasceu a Aurora niilista dual! um espetaculo.";
  }
  else if (local_14 == 0x14) {
    pcVar2 = 
    "Cinco dias a menos e voce estaria correto. Nieyzsche nasceu dia 15 de outubro de 1944.";
  }
  else if (local_14 == 10) {
    pcVar2 = "Cinco dias a mais e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1844."
    ;
  }
  else {
    pcVar2 = "Sorry, tente novamente.";
  }
  poVar1 = std::operator<<((ostream *)&std::cout,pcVar2);
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
    char eme[] = {0x1b, '[', '1', ';', '3', '5', 'm', 0};
    cout << eme;
    int x;

    cout << "Qual o dia em que nietzsche nasceu?";
    cin >> x;

    switch (x)
    {
    case 15:
        cout << "YES! No dia 15 de outubro de 1844 nasceu a Aurora niilista dual! um espetaculo." << endl;
        break;
    case 10:
        cout << "Cinco dias a mais e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1844." << endl;
        break;
    case 20:
        cout << "Cinco dias a menos e voce estaria correto. Nieyzsche nasceu dia 15 de outubro de 1944." << endl;
        break;
    case 30:
        cout << "Quinze dias a menos e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1944." << endl;
        break;
    default:
        cout << "Sorry, tente novamente." << endl;
        break;
    }

    return 0;
}